

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warn.cc
# Opt level: O1

void __thiscall re2c::Warn::set(Warn *this,type_t t,option_t o)

{
  switch(o) {
  case W:
    *(byte *)(this->mask + t) = (byte)this->mask[t] | 1;
    return;
  case WNO:
    *(byte *)(this->mask + t) = (byte)this->mask[t] & 0xfe;
    return;
  case WERROR:
    *(byte *)(this->mask + t) = (byte)this->mask[t] | 3;
    return;
  case WNOERROR:
    *(byte *)(this->mask + t) = (byte)this->mask[t] & 0xfd;
  }
  return;
}

Assistant:

void Warn::set (type_t t, option_t o)
{
	switch (o)
	{
		case W:
			mask[t] |= WARNING;
			break;
		case WNO:
			mask[t] &= ~WARNING;
			break;
		case WERROR:
			// unlike -Werror, -Werror-<warning> implies -W<warning>
			mask[t] |= (WARNING | ERROR);
			break;
		case WNOERROR:
			mask[t] &= ~ERROR;
			break;
	}
}